

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapSetInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  
  if ((sobj1->SnapObjectTag == SnapSetObject) && (sobj2->SnapObjectTag == SnapSetObject)) {
    puVar1 = (uint *)sobj1->AddtlSnapObjectInfo;
    puVar2 = (uint *)sobj2->AddtlSnapObjectInfo;
    TTDCompareMap::DiagnosticAssert(compareMap,*puVar1 == *puVar2);
    if ((sobj1->SnapType->JsTypeId == TypeIds_Set) && (*puVar1 != 0)) {
      uVar3 = 0;
      do {
        NSSnapValues::AssertSnapEquivTTDVar_SpecialArray
                  (*(TTDVar *)(*(long *)(puVar1 + 2) + uVar3 * 8),
                   *(TTDVar *)(*(long *)(puVar2 + 2) + uVar3 * 8),compareMap,L"setValues",
                   (uint32)uVar3);
        uVar3 = uVar3 + 1;
      } while (uVar3 < *puVar1);
    }
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapSetInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapSetInfo* setInfo1 = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(sobj1);
            const SnapSetInfo* setInfo2 = SnapObjectGetAddtlInfoAs<SnapSetInfo*, SnapObjectType::SnapSetObject>(sobj2);

            compareMap.DiagnosticAssert(setInfo1->SetSize == setInfo2->SetSize);

            //Treat weak set contents as ignorable
            if(sobj1->SnapType->JsTypeId == Js::TypeIds_Set)
            {
                for(uint32 i = 0; i < setInfo1->SetSize; ++i)
                {
                    NSSnapValues::AssertSnapEquivTTDVar_SpecialArray(setInfo1->SetValueArray[i], setInfo2->SetValueArray[i], compareMap, _u("setValues"), i);
                }
            }
        }